

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

void mpc_cleanup(int n,...)

{
  char in_AL;
  void *__ptr;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_100;
  undefined8 local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  uint local_38;
  undefined4 local_34;
  va_list va;
  mpc_parser_t **list;
  int i;
  int n_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_e8[1] = in_RSI;
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  __ptr = malloc((long)n << 3);
  va[0].overflow_arg_area = local_e8;
  va[0]._0_8_ = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 8;
  for (list._0_4_ = 0; (int)list < n; list._0_4_ = (int)list + 1) {
    if (local_38 < 0x29) {
      local_100 = (undefined8 *)((long)va[0].overflow_arg_area + (long)(int)local_38);
      local_38 = local_38 + 8;
    }
    else {
      local_100 = (undefined8 *)va[0]._0_8_;
      va[0]._0_8_ = va[0]._0_8_ + 8;
    }
    *(undefined8 *)((long)__ptr + (long)(int)list * 8) = *local_100;
  }
  for (list._0_4_ = 0; (int)list < n; list._0_4_ = (int)list + 1) {
    mpc_undefine(*(mpc_parser_t **)((long)__ptr + (long)(int)list * 8));
  }
  for (list._0_4_ = 0; (int)list < n; list._0_4_ = (int)list + 1) {
    mpc_delete(*(mpc_parser_t **)((long)__ptr + (long)(int)list * 8));
  }
  free(__ptr);
  return;
}

Assistant:

void mpc_cleanup(int n, ...) {
  int i;
  mpc_parser_t **list = malloc(sizeof(mpc_parser_t*) * n);

  va_list va;
  va_start(va, n);
  for (i = 0; i < n; i++) { list[i] = va_arg(va, mpc_parser_t*); }
  for (i = 0; i < n; i++) { mpc_undefine(list[i]); }
  for (i = 0; i < n; i++) { mpc_delete(list[i]); }
  va_end(va);

  free(list);
}